

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.h
# Opt level: O2

void readData<int>(Serializer *serializer,DataFieldInfo *info,Savepoint *savepoint,int **data)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  string fieldName;
  
  uVar1 = info->bytesPerElement_;
  iVar2 = info->jSize_;
  iVar3 = info->kSize_;
  iVar4 = info->lSize_;
  iVar5 = info->iSize_;
  std::__cxx11::string::string((string *)&fieldName,(string *)info);
  iVar5 = iVar3 * iVar4 * iVar5 * iVar2;
  uVar9 = 0xffffffffffffffff;
  if (-1 < iVar5) {
    uVar9 = (long)iVar5 * 4;
  }
  piVar6 = (int *)operator_new__(uVar9);
  uVar7 = iVar4 * uVar1;
  uVar8 = iVar3 * uVar7;
  *data = piVar6;
  (*serializer->_vptr_Serializer[3])
            (serializer,&fieldName,savepoint,piVar6,(ulong)(iVar2 * uVar8),(ulong)uVar8,(ulong)uVar7
             ,(ulong)uVar1,0);
  std::__cxx11::string::~string((string *)&fieldName);
  return;
}

Assistant:

void readData(const ser::Serializer& serializer, const ser::DataFieldInfo& info, const ser::Savepoint& savepoint, T*& data)
{
	int iSize = info.iSize();
	int jSize = info.jSize();
	int kSize = info.kSize();
	int lSize = info.lSize();
	int fieldLength = info.bytesPerElement();
	std::string fieldName = info.name();

	int lStride = fieldLength;
	int kStride = lSize * lStride;
	int jStride = kSize * kStride;
	int iStride = jSize * jStride;

	data = new T[iSize * jSize * kSize * lSize];
	serializer.ReadField(fieldName, savepoint, data, iStride, jStride, kStride, lStride);
}